

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O1

PixelColor color_from_gradient(Gradient *gradient,float pos)

{
  pointer pGVar1;
  pointer pGVar2;
  PixelColor PVar3;
  byte bVar4;
  pointer pGVar5;
  byte bVar6;
  pointer left;
  
  pGVar1 = (gradient->colors).super__Vector_base<GradientColor,_std::allocator<GradientColor>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pGVar2 = (gradient->colors).super__Vector_base<GradientColor,_std::allocator<GradientColor>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  left = pGVar2;
  if (pGVar1 != pGVar2) {
    pGVar1 = pGVar1 + 1;
    do {
      pGVar5 = pGVar1;
      if (pGVar5 == pGVar2) goto LAB_001054d5;
      pGVar1 = pGVar5 + 1;
    } while ((pos < pGVar5[-1].pos) || (pGVar5->pos < pos));
    left = pGVar5 + -1;
  }
LAB_001054d5:
  if (left == pGVar2) {
    PVar3.r = '\0';
    PVar3.g = '\0';
    PVar3.b = '\0';
    bVar4 = 0;
    bVar6 = 0;
  }
  else {
    PVar3 = color_from_gradient_range(left,left + 1,pos);
    bVar4 = PVar3.g;
    bVar6 = PVar3.b;
  }
  return (PixelColor)((uint3)PVar3 & 0xff | (uint3)bVar4 << 8 | (uint3)bVar6 << 0x10);
}

Assistant:

PixelColor color_from_gradient(const Gradient& gradient, const float pos) noexcept
{
    const auto end = gradient.colors.cend();

    const auto it = std::adjacent_find(gradient.colors.cbegin(), end,
        [&](const GradientColor& left, const GradientColor& right) { return left.pos <= pos && pos <= right.pos; });

    if (it != end)
        return color_from_gradient_range(*it, *(it + 1), pos);
    else
        return PixelColor{0, 0, 0};
}